

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O0

spv_result_t spvtools::val::InstructionPass(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  Capability cap;
  AddressingModel am;
  MemoryModel mm;
  spv_result_t sVar3;
  ExecutionMode execution_mode;
  uint32_t uVar4;
  DiagnosticStream *pDVar5;
  spv_result_t error_6;
  spv_result_t error_5;
  spv_result_t error_4;
  spv_result_t error_3;
  spv_result_t error_2;
  spv_result_t error_1;
  DiagnosticStream local_5c8;
  uint32_t local_3ec;
  undefined1 local_3e8 [4];
  uint32_t bitwidth;
  undefined4 local_20c;
  StorageClass local_208;
  spv_result_t error;
  StorageClass storage_class;
  uint32_t entry_point;
  Op local_24;
  Instruction *pIStack_20;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = Instruction::opcode(inst);
  pIVar1 = inst_local;
  if (local_24 == OpExtension) {
    anon_unknown_2::CheckIfKnownExtension((ValidationState_t *)inst_local,pIStack_20);
  }
  else if (local_24 == OpCapability) {
    cap = Instruction::GetOperandAs<spv::Capability>(pIStack_20,0);
    ValidationState_t::RegisterCapability((ValidationState_t *)pIVar1,cap);
  }
  else if (local_24 == OpMemoryModel) {
    bVar2 = ValidationState_t::has_memory_model_specified((ValidationState_t *)inst_local);
    pIVar1 = inst_local;
    if (bVar2) {
      ValidationState_t::diag
                ((DiagnosticStream *)&storage_class,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_LAYOUT,pIStack_20);
      pDVar5 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&storage_class,
                          (char (*) [44])"OpMemoryModel should only be provided once.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&storage_class);
      return __local._4_4_;
    }
    am = Instruction::GetOperandAs<spv::AddressingModel>(pIStack_20,0);
    ValidationState_t::set_addressing_model((ValidationState_t *)pIVar1,am);
    pIVar1 = inst_local;
    mm = Instruction::GetOperandAs<spv::MemoryModel>(pIStack_20,1);
    ValidationState_t::set_memory_model((ValidationState_t *)pIVar1,mm);
  }
  else if ((local_24 == OpExecutionMode) || (local_24 == OpExecutionModeId)) {
    sVar3 = Instruction::word(pIStack_20,1);
    pIVar1 = inst_local;
    error = sVar3;
    execution_mode = Instruction::word(pIStack_20,2);
    ValidationState_t::RegisterExecutionModeForEntryPoint
              ((ValidationState_t *)pIVar1,sVar3,execution_mode);
  }
  else if (local_24 == OpVariable) {
    local_208 = Instruction::GetOperandAs<spv::StorageClass>(pIStack_20,2);
    pIVar1 = inst_local;
    uVar4 = Instruction::id(pIStack_20);
    sVar3 = anon_unknown_2::LimitCheckNumVars((ValidationState_t *)pIVar1,uVar4,local_208);
    if (sVar3 != SPV_SUCCESS) {
      return sVar3;
    }
    local_20c = 0;
  }
  else if (local_24 == OpSamplerImageAddressingModeNV) {
    bVar2 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,BindlessTextureNV);
    if (!bVar2) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_3e8,(ValidationState_t *)inst_local,
                 SPV_ERROR_MISSING_EXTENSION,pIStack_20);
      pDVar5 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_3e8,
                          (char (*) [85])
                          "OpSamplerImageAddressingModeNV supported only with extension SPV_NV_bindless_texture"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3e8);
      return __local._4_4_;
    }
    local_3ec = Instruction::GetOperandAs<unsigned_int>(pIStack_20,0);
    uVar4 = ValidationState_t::samplerimage_variable_address_mode((ValidationState_t *)inst_local);
    if (uVar4 != 0) {
      ValidationState_t::diag
                (&local_5c8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,pIStack_20);
      pDVar5 = DiagnosticStream::operator<<
                         (&local_5c8,
                          (char (*) [60])
                          "OpSamplerImageAddressingModeNV should only be provided once");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream(&local_5c8);
      return __local._4_4_;
    }
    if ((local_3ec != 0x20) && (local_3ec != 0x40)) {
      ValidationState_t::diag
                ((DiagnosticStream *)&error_2,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA
                 ,pIStack_20);
      pDVar5 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&error_2,
                          (char (*) [59])
                          "OpSamplerImageAddressingModeNV bitwidth should be 64 or 32");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_2);
      return __local._4_4_;
    }
    ValidationState_t::set_samplerimage_variable_address_mode
              ((ValidationState_t *)inst_local,local_3ec);
  }
  __local._4_4_ = anon_unknown_2::ReservedCheck((ValidationState_t *)inst_local,pIStack_20);
  if ((((__local._4_4_ == SPV_SUCCESS) &&
       (__local._4_4_ = anon_unknown_2::CapabilityCheck((ValidationState_t *)inst_local,pIStack_20),
       __local._4_4_ == SPV_SUCCESS)) &&
      (__local._4_4_ = anon_unknown_2::LimitCheckIdBound((ValidationState_t *)inst_local,pIStack_20)
      , __local._4_4_ == SPV_SUCCESS)) &&
     (((__local._4_4_ = anon_unknown_2::LimitCheckStruct((ValidationState_t *)inst_local,pIStack_20)
       , __local._4_4_ == SPV_SUCCESS &&
       (__local._4_4_ = anon_unknown_2::LimitCheckSwitch((ValidationState_t *)inst_local,pIStack_20)
       , __local._4_4_ == SPV_SUCCESS)) &&
      (__local._4_4_ = anon_unknown_2::VersionCheck((ValidationState_t *)inst_local,pIStack_20),
      __local._4_4_ == SPV_SUCCESS)))) {
    __local._4_4_ = SPV_SUCCESS;
  }
  return __local._4_4_;
}

Assistant:

spv_result_t InstructionPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  if (opcode == spv::Op::OpExtension) {
    CheckIfKnownExtension(_, inst);
  } else if (opcode == spv::Op::OpCapability) {
    _.RegisterCapability(inst->GetOperandAs<spv::Capability>(0));
  } else if (opcode == spv::Op::OpMemoryModel) {
    if (_.has_memory_model_specified()) {
      return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
             << "OpMemoryModel should only be provided once.";
    }
    _.set_addressing_model(inst->GetOperandAs<spv::AddressingModel>(0));
    _.set_memory_model(inst->GetOperandAs<spv::MemoryModel>(1));
  } else if (opcode == spv::Op::OpExecutionMode ||
             opcode == spv::Op::OpExecutionModeId) {
    const uint32_t entry_point = inst->word(1);
    _.RegisterExecutionModeForEntryPoint(entry_point,
                                         spv::ExecutionMode(inst->word(2)));
  } else if (opcode == spv::Op::OpVariable) {
    const auto storage_class = inst->GetOperandAs<spv::StorageClass>(2);
    if (auto error = LimitCheckNumVars(_, inst->id(), storage_class)) {
      return error;
    }
  } else if (opcode == spv::Op::OpSamplerImageAddressingModeNV) {
    if (!_.HasCapability(spv::Capability::BindlessTextureNV)) {
      return _.diag(SPV_ERROR_MISSING_EXTENSION, inst)
             << "OpSamplerImageAddressingModeNV supported only with extension "
                "SPV_NV_bindless_texture";
    }
    uint32_t bitwidth = inst->GetOperandAs<uint32_t>(0);
    if (_.samplerimage_variable_address_mode() != 0) {
      return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
             << "OpSamplerImageAddressingModeNV should only be provided once";
    }
    if (bitwidth != 32 && bitwidth != 64) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "OpSamplerImageAddressingModeNV bitwidth should be 64 or 32";
    }
    _.set_samplerimage_variable_address_mode(bitwidth);
  }

  if (auto error = ReservedCheck(_, inst)) return error;
  if (auto error = CapabilityCheck(_, inst)) return error;
  if (auto error = LimitCheckIdBound(_, inst)) return error;
  if (auto error = LimitCheckStruct(_, inst)) return error;
  if (auto error = LimitCheckSwitch(_, inst)) return error;
  if (auto error = VersionCheck(_, inst)) return error;

  // All instruction checks have passed.
  return SPV_SUCCESS;
}